

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtw_stb_image.h
# Opt level: O0

void __thiscall rtw_image::convert_to_bytes(rtw_image *this)

{
  uchar uVar1;
  int iVar2;
  uchar *puVar3;
  ulong uVar4;
  int local_2c;
  float *pfStack_28;
  int i;
  float *fptr;
  uchar *bptr;
  int total_bytes;
  rtw_image *this_local;
  
  iVar2 = this->image_width * this->image_height * this->bytes_per_pixel;
  uVar4 = (ulong)iVar2;
  if ((long)uVar4 < 0) {
    uVar4 = 0xffffffffffffffff;
  }
  puVar3 = (uchar *)operator_new__(uVar4);
  this->bdata = puVar3;
  fptr = (float *)this->bdata;
  pfStack_28 = this->fdata;
  for (local_2c = 0; local_2c < iVar2; local_2c = local_2c + 1) {
    uVar1 = float_to_byte(*pfStack_28);
    *(uchar *)fptr = uVar1;
    pfStack_28 = pfStack_28 + 1;
    fptr = (float *)((long)fptr + 1);
  }
  return;
}

Assistant:

void convert_to_bytes() {
        // Convert the linear floating point pixel data to bytes, storing the resulting byte
        // data in the `bdata` member.

        int total_bytes = image_width * image_height * bytes_per_pixel;
        bdata = new unsigned char[total_bytes];

        // Iterate through all pixel components, converting from [0.0, 1.0] float values to
        // unsigned [0, 255] byte values.

        auto *bptr = bdata;
        auto *fptr = fdata;
        for (auto i=0; i < total_bytes; i++, fptr++, bptr++)
            *bptr = float_to_byte(*fptr);
    }